

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O3

void units_reg(void)

{
  Symbol *pSVar1;
  List *pLVar2;
  double d2;
  double d1;
  char u [8192];
  double dStack_2048;
  double local_2040;
  char local_2038 [8200];
  
  lappendstr(defs_list,"static HocParmUnits _hoc_parm_units[] = {\n");
  pLVar2 = syminorder->next;
  if (pLVar2 != syminorder) {
    do {
      pSVar1 = (pLVar2->element).sym;
      if ((pSVar1->nrntype & 0x40) != 0) {
        decode_ustr(pSVar1,&local_2040,&dStack_2048,local_2038);
        if (local_2038[0] != '\0') {
          sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,suffix,local_2038);
          lappendstr(defs_list,buf);
        }
      }
      pLVar2 = pLVar2->next;
    } while (pLVar2 != syminorder);
  }
  pLVar2 = rangeparm->next;
  if (pLVar2 != rangeparm) {
    do {
      pSVar1 = (pLVar2->element).sym;
      decode_ustr(pSVar1,&local_2040,&dStack_2048,local_2038);
      if (local_2038[0] != '\0') {
        sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,local_2038);
        lappendstr(defs_list,buf);
      }
      pLVar2 = pLVar2->next;
    } while (pLVar2 != rangeparm);
  }
  pLVar2 = rangestate->next;
  if (pLVar2 != rangestate) {
    do {
      pSVar1 = (pLVar2->element).sym;
      decode_ustr(pSVar1,&local_2040,&dStack_2048,local_2038);
      if (local_2038[0] != '\0') {
        sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,local_2038);
        lappendstr(defs_list,buf);
      }
      pLVar2 = pLVar2->next;
    } while (pLVar2 != rangestate);
  }
  pLVar2 = rangedep->next;
  if (pLVar2 != rangedep) {
    do {
      pSVar1 = (pLVar2->element).sym;
      decode_ustr(pSVar1,&local_2040,&dStack_2048,local_2038);
      if (local_2038[0] != '\0') {
        sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,local_2038);
        lappendstr(defs_list,buf);
      }
      pLVar2 = pLVar2->next;
    } while (pLVar2 != rangedep);
  }
  pLVar2 = nrnpointers->next;
  if (pLVar2 != nrnpointers) {
    do {
      pSVar1 = (pLVar2->element).sym;
      decode_ustr(pSVar1,&local_2040,&dStack_2048,local_2038);
      if (local_2038[0] != '\0') {
        sprintf(buf,"\"%s%s\", \"%s\",\n",pSVar1->name,rsuffix,local_2038);
        lappendstr(defs_list,buf);
      }
      pLVar2 = pLVar2->next;
    } while (pLVar2 != nrnpointers);
  }
  lappendstr(defs_list,"0,0\n};\n");
  return;
}

Assistant:

void units_reg() {
	Symbol* s;
	Item* q;
	double d1, d2;
	char u[NRN_BUFSIZE];
	
	Lappendstr(defs_list, "static HocParmUnits _hoc_parm_units[] = {\n");
	ITERATE (q, syminorder) {
		s = SYM(q);
		if (s->nrntype & NRNGLOBAL) {
			decode_ustr(s, &d1, &d2, u);
			if (u[0]) {
				sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, suffix, u);
				lappendstr(defs_list, buf);
			}
		}
	}
	ITERATE (q, rangeparm) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	ITERATE (q, rangestate) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	ITERATE (q, rangedep) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	ITERATE (q, nrnpointers) {
		s = SYM(q);
		decode_ustr(s, &d1, &d2, u);
		if (u[0]) {
			sprintf(buf, "\"%s%s\", \"%s\",\n", s->name, rsuffix, u);
			lappendstr(defs_list, buf);
		}
	}
	Lappendstr(defs_list, "0,0\n};\n");
}